

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

void __thiscall tchecker::syncprod::system_t::system_t(system_t *this,system_declaration_t *sysdecl)

{
  tchecker::system::system_t::system_t(&this->super_system_t,sysdecl);
  memset(&this->super_labels_t,0,0x98);
  extract_asynchronous_edges(this);
  compute_committed_locations(this);
  compute_labels(this);
  return;
}

Assistant:

system_t::system_t(tchecker::parsing::system_declaration_t const & sysdecl) : tchecker::system::system_t(sysdecl)
{
  extract_asynchronous_edges();
  compute_committed_locations();
  compute_labels();
}